

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O1

Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *
LoadAddrman(Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *__return_storage_ptr__
           ,NetGroupManager *netgroupman,ArgsManager *args)

{
  char *pcVar1;
  string_view source_file;
  _Head_base<0UL,_AddrMan_*,_false> _Var2;
  bool bVar3;
  int64_t iVar4;
  AddrMan *this;
  long lVar5;
  CChainParams *pCVar6;
  long lVar7;
  Logger *pLVar8;
  runtime_error *this_00;
  uint uVar9;
  size_t sVar10;
  code *pcVar11;
  pointer_____offset_0x10___ *ppuVar12;
  long *in_R8;
  uint uVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  string_view str;
  string_view logging_function;
  __single_object addrman;
  bool deterministic;
  int check_addrman;
  MessageStartChars pchMsgTmp;
  path path_addr;
  HashVerifier<AutoFile> verifier;
  uint256 hashTmp;
  __uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> local_2c8;
  unsigned_long local_2c0;
  _Head_base<0UL,_AddrMan_*,_false> local_2b8;
  undefined1 local_2ad;
  uint local_2ac;
  size_t local_2a8 [2];
  _Type local_294 [47];
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1c8 [7];
  path local_158;
  path local_130;
  undefined1 local_108 [104];
  AutoFile *local_a0;
  uint256 local_78;
  undefined1 local_58 [9];
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = local_108 + 0x10;
  local_108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-checkaddrman","");
  iVar4 = ArgsManager::GetIntArg(args,(string *)local_108,0);
  uVar9 = 1000000;
  if ((int)(uint)iVar4 < 1000000) {
    uVar9 = (uint)iVar4;
  }
  uVar13 = 0;
  if (0 < (int)uVar9) {
    uVar13 = uVar9;
  }
  if ((char *)local_108._0_8_ != pcVar1) {
    operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
  }
  local_2ac = uVar13;
  local_108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"addrman","");
  bVar3 = HasTestOption(args,(string *)local_108);
  if ((char *)local_108._0_8_ != pcVar1) {
    operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
  }
  local_2ad = bVar3;
  this = (AddrMan *)operator_new(8);
  sVar10 = (size_t)local_2ac;
  AddrMan::AddrMan(this,netgroupman,bVar3,local_2ac);
  local_2b8._M_head_impl = this;
  lVar5 = std::chrono::_V2::steady_clock::now();
  ArgsManager::GetDataDir((path *)&local_158,args,true);
  std::filesystem::__cxx11::path::_M_append(&local_158,9,"peers.dat");
  std::filesystem::__cxx11::path::path(&local_130,&local_158);
  std::filesystem::__cxx11::path::~path(&local_158);
  _Var2._M_head_impl = local_2b8._M_head_impl;
  local_1d8._0_8_ = fsbridge::fopen((char *)&local_130,"rb");
  stack0xfffffffffffffe30 = (undefined1  [16])0x0;
  aaStack_1c8[0]._8_8_ = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this_00 = &PTR__exception_00b3a780;
    pcVar11 = std::exception::~exception;
    ppuVar12 = &(anonymous_namespace)::DbNotFoundError::typeinfo;
  }
  else {
    CSHA256::CSHA256((CSHA256 *)local_108);
    local_a0 = (AutoFile *)local_1d8;
    AutoFile::read(local_a0,(int)local_294,(void *)0x4,sVar10);
    CSHA256::Write((CSHA256 *)local_108,local_294[0],4);
    pCVar6 = Params();
    sVar10 = (size_t)(uint)local_294[0];
    if (local_294[0] == *&(pCVar6->pchMessageStart)._M_elems) {
      AddrMan::Unserialize<HashVerifier<AutoFile>>
                (_Var2._M_head_impl,(HashVerifier<AutoFile> *)local_108);
      local_48 = (undefined1  [16])0x0;
      _local_58 = (undefined1  [16])0x0;
      AutoFile::read((AutoFile *)local_1d8,(int)local_58,(void *)0x20,sVar10);
      HashWriter::GetHash(&local_78,(HashWriter *)local_108);
      auVar15[0] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x10] == local_48[0]);
      auVar15[1] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x11] == local_48[1]);
      auVar15[2] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x12] == local_48[2]);
      auVar15[3] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x13] == local_48[3]);
      auVar15[4] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x14] == local_48[4]);
      auVar15[5] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x15] == local_48[5]);
      auVar15[6] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x16] == local_48[6]);
      auVar15[7] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x17] == local_48[7]);
      auVar15[8] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x18] == local_48[8]);
      auVar15[9] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x19] == local_48[9]);
      auVar15[10] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x1a] == local_48[10]);
      auVar15[0xb] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x1b] == local_48[0xb]);
      auVar15[0xc] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x1c] == local_48[0xc]);
      auVar15[0xd] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x1d] == local_48[0xd]);
      auVar15[0xe] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x1e] == local_48[0xe]);
      auVar15[0xf] = -(local_78.super_base_blob<256U>.m_data._M_elems[0x1f] == local_48[0xf]);
      auVar14[0] = -(local_78.super_base_blob<256U>.m_data._M_elems[0] == local_58[0]);
      auVar14[1] = -(local_78.super_base_blob<256U>.m_data._M_elems[1] == local_58[1]);
      auVar14[2] = -(local_78.super_base_blob<256U>.m_data._M_elems[2] == local_58[2]);
      auVar14[3] = -(local_78.super_base_blob<256U>.m_data._M_elems[3] == local_58[3]);
      auVar14[4] = -(local_78.super_base_blob<256U>.m_data._M_elems[4] == local_58[4]);
      auVar14[5] = -(local_78.super_base_blob<256U>.m_data._M_elems[5] == local_58[5]);
      auVar14[6] = -(local_78.super_base_blob<256U>.m_data._M_elems[6] == local_58[6]);
      auVar14[7] = -(local_78.super_base_blob<256U>.m_data._M_elems[7] == local_58[7]);
      auVar14[8] = -(local_78.super_base_blob<256U>.m_data._M_elems[8] == local_58[8]);
      auVar14[9] = -(local_78.super_base_blob<256U>.m_data._M_elems[9] == uStack_4f);
      auVar14[10] = -(local_78.super_base_blob<256U>.m_data._M_elems[10] == uStack_4e);
      auVar14[0xb] = -(local_78.super_base_blob<256U>.m_data._M_elems[0xb] == uStack_4d);
      auVar14[0xc] = -(local_78.super_base_blob<256U>.m_data._M_elems[0xc] == uStack_4c);
      auVar14[0xd] = -(local_78.super_base_blob<256U>.m_data._M_elems[0xd] == uStack_4b);
      auVar14[0xe] = -(local_78.super_base_blob<256U>.m_data._M_elems[0xe] == uStack_4a);
      auVar14[0xf] = -(local_78.super_base_blob<256U>.m_data._M_elems[0xf] == uStack_49);
      auVar14 = auVar14 & auVar15;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
        AutoFile::~AutoFile((AutoFile *)local_1d8);
        local_2a8[0] = AddrMan::Size(local_2b8._M_head_impl,(optional<Network>)0x0,
                                     (optional<bool>)0x0);
        lVar7 = std::chrono::_V2::steady_clock::now();
        local_2c0 = (lVar7 - lVar5) / 1000000;
        pLVar8 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar8);
        if (bVar3) {
          local_108._8_8_ = 0;
          local_108[0x10] = '\0';
          local_108._0_8_ = pcVar1;
          tinyformat::format<unsigned_long,long>
                    ((string *)local_1d8,(tinyformat *)"Loaded %i addresses from peers.dat  %dms\n",
                     (char *)local_2a8,&local_2c0,in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_ != aaStack_1c8) {
            operator_delete((void *)local_1d8._0_8_,
                            (ulong)(aaStack_1c8[0]._M_allocated_capacity + 1));
          }
          pLVar8 = LogInstance();
          stack0xffffffffffffffb0 =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp"
          ;
          local_58._0_8_ = 0x53;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp"
          ;
          source_file._M_len = 0x53;
          str._M_str = (char *)local_108._0_8_;
          str._M_len = local_108._8_8_;
          logging_function._M_str = "LoadAddrman";
          logging_function._M_len = 0xb;
          BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0xca,ALL,Info);
          if ((char *)local_108._0_8_ != pcVar1) {
            operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
          }
        }
        _Var2._M_head_impl = local_2b8._M_head_impl;
        local_2b8._M_head_impl = (AddrMan *)0x0;
        *(AddrMan **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>
          .super__Move_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Copy_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Move_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Variant_storage_alias<bilingual_str,_std::unique_ptr<AddrMan>_> =
             _Var2._M_head_impl;
        local_2c8._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
             (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
             (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>
                 .super__Move_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Copy_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Move_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Variant_storage_alias<bilingual_str,_std::unique_ptr<AddrMan>_> + 0x40) =
             '\x01';
        std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
                  ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)&local_2c8);
        std::filesystem::__cxx11::path::~path(&local_130);
        std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
                  ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)&local_2b8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
        goto LAB_00449db1;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Checksum mismatch, data corrupted");
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Invalid network magic number");
    }
    pcVar11 = std::runtime_error::~runtime_error;
    ppuVar12 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this_00,ppuVar12,pcVar11);
  }
LAB_00449db1:
  __stack_chk_fail();
}

Assistant:

util::Result<std::unique_ptr<AddrMan>> LoadAddrman(const NetGroupManager& netgroupman, const ArgsManager& args)
{
    auto check_addrman = std::clamp<int32_t>(args.GetIntArg("-checkaddrman", DEFAULT_ADDRMAN_CONSISTENCY_CHECKS), 0, 1000000);
    bool deterministic = HasTestOption(args, "addrman"); // use a deterministic addrman only for tests

    auto addrman{std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman)};

    const auto start{SteadyClock::now()};
    const auto path_addr{args.GetDataDirNet() / "peers.dat"};
    try {
        DeserializeFileDB(path_addr, *addrman);
        LogPrintf("Loaded %i addresses from peers.dat  %dms\n", addrman->Size(), Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
    } catch (const DbNotFoundError&) {
        // Addrman can be in an inconsistent state after failure, reset it
        addrman = std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman);
        LogPrintf("Creating peers.dat because the file was not found (%s)\n", fs::quoted(fs::PathToString(path_addr)));
        DumpPeerAddresses(args, *addrman);
    } catch (const InvalidAddrManVersionError&) {
        if (!RenameOver(path_addr, (fs::path)path_addr + ".bak")) {
            return util::Error{strprintf(_("Failed to rename invalid peers.dat file. Please move or delete it and try again."))};
        }
        // Addrman can be in an inconsistent state after failure, reset it
        addrman = std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman);
        LogPrintf("Creating new peers.dat because the file version was not compatible (%s). Original backed up to peers.dat.bak\n", fs::quoted(fs::PathToString(path_addr)));
        DumpPeerAddresses(args, *addrman);
    } catch (const std::exception& e) {
        return util::Error{strprintf(_("Invalid or corrupt peers.dat (%s). If you believe this is a bug, please report it to %s. As a workaround, you can move the file (%s) out of the way (rename, move, or delete) to have a new one created on the next start."),
                                     e.what(), PACKAGE_BUGREPORT, fs::quoted(fs::PathToString(path_addr)))};
    }
    return addrman;
}